

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Close(CopyingFileInputStream *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int *size;
  void **in_RSI;
  CopyingFileInputStream *this_00;
  
  if (this->is_closed_ != true) {
    this->is_closed_ = true;
    iVar2 = anon_unknown_4::close_no_eintr(this->file_);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      this->errno_ = *piVar3;
    }
    return iVar2 == 0;
  }
  this_00 = (CopyingFileInputStream *)&stack0xffffffffffffffe0;
  Close(this_00);
  bVar1 = CopyingInputStreamAdaptor::Next
                    ((CopyingInputStreamAdaptor *)&this_00[1].file_,in_RSI,size);
  return bVar1;
}

Assistant:

bool FileInputStream::CopyingFileInputStream::Close() {
  ABSL_CHECK(!is_closed_);

  is_closed_ = true;
  if (close_no_eintr(file_) != 0) {
    // The docs on close() do not specify whether a file descriptor is still
    // open after close() fails with EIO.  However, the glibc source code
    // seems to indicate that it is not.
    errno_ = errno;
    return false;
  }

  return true;
}